

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O2

void td<Result<unsigned_int,double>>(ostream *os,Result<unsigned_int,_double> *r)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"<tr>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"<td>");
  poVar1 = std::operator<<(poVar1,(string *)&r->description);
  poVar1 = std::operator<<(poVar1,"</td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  td<Result<unsigned_int,double>>(os,&r->absoluteErrors);
  td<Result<unsigned_int,double>>(os,&r->relativeErrors);
  std::operator<<(os,"<td>");
  poVar1 = std::ostream::_M_insert<double>(r->stddev);
  poVar1 = std::operator<<(poVar1,"</td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"<td>");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(float)(r->callNs - r->overheadNs) / (float)r->samplesInRange);
  poVar1 = std::operator<<(poVar1,"</td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"</tr>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void td(std::ostream& os, const ResultT& r)
{
    os << "<tr>" << std::endl;
    os << "<td>" << r.description << "</td>" << std::endl;
    td<ResultT>(os, r.absoluteErrors);
    td<ResultT>(os, r.relativeErrors);
    os << "<td>" << r.stddev << "</td>" << std::endl;
    os << "<td>" << float(r.callNs - r.overheadNs) / float(r.samplesInRange) << "</td>" << std::endl;
    os << "</tr>" << std::endl;
}